

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cio.c
# Opt level: O0

OPJ_OFF_T opj_stream_get_number_byte_left(opj_stream_private_t *p_stream)

{
  long local_18;
  opj_stream_private_t *p_stream_local;
  
  if (p_stream->m_byte_offset < 0) {
    __assert_fail("p_stream->m_byte_offset >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/cio.c"
                  ,0x24a,"OPJ_OFF_T opj_stream_get_number_byte_left(const opj_stream_private_t *)");
  }
  if ((ulong)p_stream->m_byte_offset <= p_stream->m_user_data_length) {
    if (p_stream->m_user_data_length == 0) {
      local_18 = 0;
    }
    else {
      local_18 = p_stream->m_user_data_length - p_stream->m_byte_offset;
    }
    return local_18;
  }
  __assert_fail("p_stream->m_user_data_length >= (OPJ_UINT64)p_stream->m_byte_offset",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/cio.c"
                ,0x24b,"OPJ_OFF_T opj_stream_get_number_byte_left(const opj_stream_private_t *)");
}

Assistant:

OPJ_OFF_T opj_stream_get_number_byte_left(const opj_stream_private_t * p_stream)
{
    assert(p_stream->m_byte_offset >= 0);
    assert(p_stream->m_user_data_length >= (OPJ_UINT64)p_stream->m_byte_offset);
    return p_stream->m_user_data_length ?
           (OPJ_OFF_T)(p_stream->m_user_data_length) - p_stream->m_byte_offset :
           0;
}